

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-client.c
# Opt level: O0

int lws_tls_client_vhost_extra_cert_mem(lws_vhost *vh,uint8_t *der,size_t der_len)

{
  int iVar1;
  X509 *x_00;
  X509_STORE *ctx;
  int n;
  X509 *x;
  X509_STORE *st;
  size_t der_len_local;
  uint8_t *der_local;
  lws_vhost *vh_local;
  
  der_len_local = (size_t)der;
  der_local = (uint8_t *)vh;
  x_00 = d2i_X509((X509 **)0x0,(uchar **)&der_len_local,der_len);
  if (x_00 == (X509 *)0x0) {
    _lws_log(1,"%s: Failed to load DER\n","lws_tls_client_vhost_extra_cert_mem");
    lws_tls_err_describe_clear();
    vh_local._4_4_ = 1;
  }
  else {
    ctx = SSL_CTX_get_cert_store(*(SSL_CTX **)(der_local + 0x2c8));
    if (ctx == (X509_STORE *)0x0) {
      _lws_log(1,"%s: failed to get cert store\n","lws_tls_client_vhost_extra_cert_mem");
      X509_free(x_00);
      vh_local._4_4_ = 1;
    }
    else {
      iVar1 = X509_STORE_add_cert(ctx,x_00);
      if (iVar1 != 1) {
        _lws_log(1,"%s: failed to add cert\n","lws_tls_client_vhost_extra_cert_mem");
      }
      X509_free(x_00);
      vh_local._4_4_ = (uint)(iVar1 != 1);
    }
  }
  return vh_local._4_4_;
}

Assistant:

int
lws_tls_client_vhost_extra_cert_mem(struct lws_vhost *vh,
                const uint8_t *der, size_t der_len)
{
	X509_STORE *st;
#if defined(USE_WOLFSSL)
	X509 *x  = d2i_X509(NULL, &der, (int)der_len);
#else
	X509 *x  = d2i_X509(NULL, &der, (long)der_len);
#endif
	int n;

	if (!x) {
		lwsl_err("%s: Failed to load DER\n", __func__);
		lws_tls_err_describe_clear();
		return 1;
	}

	st = SSL_CTX_get_cert_store(vh->tls.ssl_client_ctx);
	if (!st) {
		lwsl_err("%s: failed to get cert store\n", __func__);
		X509_free(x);
		return 1;
	}

	n = X509_STORE_add_cert(st, x);
	if (n != 1)
		lwsl_err("%s: failed to add cert\n", __func__);

	X509_free(x);

	return n != 1;
}